

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>::
lower_upper_bound_dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *this)

{
  Siblings *pSVar1;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
  *pSVar2;
  int iVar3;
  int iVar4;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
  local_30;
  
  this->dimension_to_be_lowered_ = false;
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    iVar4 = -1;
  }
  else {
    local_30.sh_.m_ptr =
         (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
          *)(this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    pSVar1 = (((pointer)local_30.sh_.m_ptr)->second).children_;
    if (pSVar1->parent_ == ((pointer)local_30.sh_.m_ptr)->first) {
      do {
        local_30.sib_ = pSVar1;
        local_30.sh_.m_ptr =
             (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>_>
              *)((local_30.sib_)->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
        pSVar1 = (((pointer)local_30.sh_.m_ptr)->second).children_;
      } while (pSVar1->parent_ == ((pointer)local_30.sh_.m_ptr)->first);
    }
    else {
      local_30.sib_ = &this->root_;
    }
    iVar4 = -1;
    local_30.st_ = this;
    do {
      pSVar2 = ((local_30.sh_.m_ptr)->second).children_;
      if ((pSVar2->parent_ == (local_30.sh_.m_ptr)->first) &&
         (pSVar2 = pSVar2->oncles_, pSVar2 == (Siblings *)0x0)) {
        iVar3 = -1;
      }
      else {
        iVar3 = -1;
        do {
          iVar3 = iVar3 + 1;
          pSVar2 = pSVar2->oncles_;
        } while (pSVar2 != (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>,_std::less<short>,_void>_>
                            *)0x0);
      }
      if (this->dimension_ <= iVar3) {
        return false;
      }
      if (iVar4 <= iVar3) {
        iVar4 = iVar3;
      }
      Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence>_>
      ::increment(&local_30);
    } while (local_30.st_ !=
             (Simplex_tree<Gudhi::Simplex_tree_options_custom_fil_values_fast_persistence> *)0x0);
  }
  this->dimension_ = iVar4;
  return true;
}

Assistant:

bool lower_upper_bound_dimension() const {
    // reset automatic detection to recompute
    dimension_to_be_lowered_ = false;
    int new_dimension = -1;
    // Browse the tree from the left to the right as higher dimension cells are more likely on the left part of the tree
    for (Simplex_handle sh : complex_simplex_range()) {
#ifdef DEBUG_TRACES
      for (auto vertex : simplex_vertex_range(sh)) {
        std::clog << " " << vertex;
      }
      std::clog << std::endl;
#endif  // DEBUG_TRACES

      int sh_dimension = dimension(sh);
      if (sh_dimension >= dimension_)
        // Stop browsing as soon as the dimension is reached, no need to go further
        return false;
      new_dimension = (std::max)(new_dimension, sh_dimension);
    }
    dimension_ = new_dimension;
    return true;
  }